

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_LdSlotPrimitive<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>,_SIMDValue>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  
  puVar1 = (undefined8 *)
           (*(long *)(this + (ulong)playout->Instance * 8 + 0x160) +
           (ulong)playout->SlotIndex * 0x10);
  uVar3 = puVar1[1];
  puVar2 = (undefined8 *)(*(long *)(this + 0x148) + (ulong)playout->Value * 0x10);
  *puVar2 = *puVar1;
  puVar2[1] = uVar3;
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdSlotPrimitive(const unaligned T* playout)
    {
        T2* buffer = (T2*)GetNonVarReg(playout->Instance);
        SetRegRaw<T2>(playout->Value, buffer[playout->SlotIndex]);
    }